

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall
haVoc::Movehistory::update
          (Movehistory *this,position *p,Move *m,Move *previous,int16 *depth,Score *eval,
          vector<Move,_std::allocator<Move>_> *quiets,Move *killers)

{
  bool bVar1;
  Color CVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference this_00;
  reference this_01;
  reference pMVar6;
  double dVar7;
  Move *q;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Move,_std::allocator<Move>_> *__range2;
  int score;
  Color c;
  Score *eval_local;
  int16 *depth_local;
  Move *previous_local;
  Move *m_local;
  position *p_local;
  Movehistory *this_local;
  
  CVar2 = position::to_move(p);
  dVar7 = pow((double)(int)*depth,2.0);
  if (m->type == '\n') {
    pvVar3 = std::array<std::array<std::array<int,_64UL>,_64UL>,_2UL>::operator[]
                       (&this->history,(ulong)CVar2);
    pvVar4 = std::array<std::array<int,_64UL>,_64UL>::operator[](pvVar3,(ulong)m->f);
    pvVar5 = std::array<int,_64UL>::operator[](pvVar4,(ulong)m->t);
    *pvVar5 = (int)dVar7 + *pvVar5;
    this_00 = std::array<std::array<Move,_64UL>,_64UL>::operator[]
                        (&this->counters,(ulong)previous->f);
    this_01 = std::array<Move,_64UL>::operator[](this_00,(ulong)previous->t);
    Move::operator=(this_01,m);
    if ((((*eval < mate_max_ply) && (bVar1 = Move::operator!=(m,killers + 2), bVar1)) &&
        (bVar1 = Move::operator!=(m,killers + 3), bVar1)) &&
       (bVar1 = Move::operator!=(m,killers), bVar1)) {
      Move::operator=(killers + 1,killers);
      Move::operator=(killers,m);
    }
    __end2 = std::vector<Move,_std::allocator<Move>_>::begin(quiets);
    q = (Move *)std::vector<Move,_std::allocator<Move>_>::end(quiets);
    while (bVar1 = __gnu_cxx::operator==<const_Move_*,_std::vector<Move,_std::allocator<Move>_>_>
                             (&__end2,(__normal_iterator<const_Move_*,_std::vector<Move,_std::allocator<Move>_>_>
                                       *)&q), ((bVar1 ^ 0xffU) & 1) != 0) {
      pMVar6 = __gnu_cxx::__normal_iterator<const_Move_*,_std::vector<Move,_std::allocator<Move>_>_>
               ::operator*(&__end2);
      if (m->f != pMVar6->f) {
        pvVar3 = std::array<std::array<std::array<int,_64UL>,_64UL>,_2UL>::operator[]
                           (&this->history,(ulong)CVar2);
        pvVar4 = std::array<std::array<int,_64UL>,_64UL>::operator[](pvVar3,(ulong)pMVar6->f);
        pvVar5 = std::array<int,_64UL>::operator[](pvVar4,(ulong)pMVar6->t);
        *pvVar5 = *pvVar5 - (int)dVar7;
      }
      __gnu_cxx::__normal_iterator<const_Move_*,_std::vector<Move,_std::allocator<Move>_>_>::
      operator++(&__end2);
    }
  }
  if (((~mated_max_ply < *eval) && (bVar1 = Move::operator!=(m,killers), bVar1)) &&
     ((bVar1 = Move::operator!=(m,killers + 1), bVar1 &&
      (bVar1 = Move::operator!=(m,killers + 2), bVar1)))) {
    Move::operator=(killers + 3,killers + 2);
    Move::operator=(killers + 2,m);
  }
  return;
}

Assistant:

void Movehistory::update(const position& p,
		const Move& m,
		const Move& previous,
		const int16& depth,
		const Score& eval,
		const std::vector<Move>& quiets,
		Move* killers) {

		const Color c = p.to_move();
		int score = pow(depth, 2);
		if (m.type == Movetype::quiet) {
			history[c][m.f][m.t] += score;
			counters[previous.f][previous.t] = m;
			if (eval < Score::mate_max_ply &&
				m != killers[2] &&
				m != killers[3] &&
				m != killers[0]) {
				killers[1] = killers[0];
				killers[0] = m;
			}
			for (auto& q : quiets) {
				if (m.f == q.f) continue;
				history[c][q.f][q.t] -= score;
			}
		}

		// mate killers
		if (eval >= Score::mate_max_ply &&
			m != killers[0] &&
			m != killers[1] &&
			m != killers[2]) {
			killers[3] = killers[2];
			killers[2] = m;
		}
	}